

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyze.cpp
# Opt level: O2

void __thiscall
CaDiCaL::Internal::otfs_subsume_clause(Internal *this,Clause *subsuming,Clause *subsumed)

{
  int64_t *piVar1;
  long *plVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  
  piVar1 = &(this->stats).subsumed;
  *piVar1 = *piVar1 + 1;
  plVar2 = (long *)((long)&(this->stats).subirr + (ulong)(*(uint *)&subsumed->field_0x8 >> 8 & 8));
  *plVar2 = *plVar2 + 1;
  if (((subsumed->field_0x9 & 8) == 0) && ((*(uint *)&subsuming->field_0x8 >> 0xb & 1) != 0)) {
    *(uint *)&subsuming->field_0x8 = *(uint *)&subsuming->field_0x8 & 0xfffff7ff;
    if (this->proof != (Proof *)0x0) {
      Proof::strengthen(this->proof,(subsuming->field_0).id);
    }
    mark_garbage(this,subsumed);
    piVar1 = &(this->stats).irrlits;
    *piVar1 = *piVar1 + (long)subsuming->size;
    lVar3 = (this->stats).current.irredundant;
    lVar4 = (this->stats).added.redundant;
    lVar5 = (this->stats).added.irredundant;
    (this->stats).current.redundant = (this->stats).current.redundant + -1;
    (this->stats).current.irredundant = lVar3 + 1;
    (this->stats).added.redundant = lVar4 + -1;
    (this->stats).added.irredundant = lVar5 + 1;
    return;
  }
  mark_garbage(this,subsumed);
  return;
}

Assistant:

inline void Internal::otfs_subsume_clause (Clause *subsuming,
                                           Clause *subsumed) {
  stats.subsumed++;
  assert (subsuming->size <= subsumed->size);
  LOG (subsumed, "subsumed");
  if (subsumed->redundant)
    stats.subred++;
  else
    stats.subirr++;
  if (subsumed->redundant || !subsuming->redundant) {
    mark_garbage (subsumed);
    return;
  }
  LOG ("turning redundant subsuming clause into irredundant clause");
  subsuming->redundant = false;
  if (proof)
    proof->strengthen (subsuming->id);
  mark_garbage (subsumed);
  stats.current.irredundant++;
  stats.added.irredundant++;
  stats.irrlits += subsuming->size;
  assert (stats.current.redundant > 0);
  stats.current.redundant--;
  assert (stats.added.redundant > 0);
  stats.added.redundant--;
  // ... and keep 'stats.added.total'.
}